

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_thingstoblowup.cpp
# Opt level: O2

int AF_A_Explode512(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  AActor *bombspot;
  char *__assertion;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055231a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    bombspot = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (bombspot == (AActor *)0x0) {
LAB_005521f2:
        bombspot = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)bombspot,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0055231a;
        }
      }
      if (numparam == 1) goto LAB_00552272;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0055230a;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0055231a;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0055230a;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00552272:
        obj = &bombspot->target;
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        local_1c.Index = 0;
        P_RadiusAttack(bombspot,pAVar3,0x200,0x200,&local_1c,1,0);
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar3 != (AActor *)0x0) {
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
          if (pAVar3->player != (player_t *)0x0) {
            pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
            pAVar3->player->extralight = 5;
          }
        }
        P_CheckSplash(bombspot,512.0);
        bombspot->RenderStyle = LegacyRenderStyles[7];
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0055231a;
    }
    if (bombspot == (AActor *)0x0) goto LAB_005521f2;
  }
LAB_0055230a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0055231a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_thingstoblowup.cpp"
                ,0x4d,"int AF_A_Explode512(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Explode512)
{
	PARAM_ACTION_PROLOGUE;

	P_RadiusAttack (self, self->target, 512, 512, NAME_None, RADF_HURTSOURCE);
	if (self->target != NULL && self->target->player != NULL)
	{
		self->target->player->extralight = 5;
	}
	P_CheckSplash(self, 512);

	// Strife didn't do this next part, but it looks good
	self->RenderStyle = STYLE_Add;
	return 0;
}